

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall GlobOpt::DoFieldPRE(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeProfileInfo *this_00;
  Loop *loop_local;
  GlobOpt *this_local;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FieldPREPhase,uVar2,uVar3);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,FieldPREPhase,uVar2,uVar3);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = Func::HasProfileInfo(this->func);
      if (bVar1) {
        this_00 = Func::GetReadOnlyProfileInfo(this->func);
        bVar1 = JITTimeProfileInfo::IsFieldPREDisabled(this_00);
        if (bVar1) {
          return false;
        }
      }
      this_local._7_1_ = DoFieldOpts(this,loop);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::DoFieldPRE(Loop *loop) const
{
    if (PHASE_OFF(Js::FieldPREPhase, this->func))
    {
        return false;
    }

    if (PHASE_FORCE(Js::FieldPREPhase, func))
    {
        // Force always turns on field PRE
        return true;
    }

    if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsFieldPREDisabled())
    {
        return false;
    }

    return DoFieldOpts(loop);
}